

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

int uECC_generate_random_int(uECC_word_t *random,uECC_word_t *top,wordcount_t num_words)

{
  cmpresult_t cVar1;
  bitcount_t bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  bVar2 = uECC_vli_numBits(top,num_words);
  if (g_rng_function != (uECC_RNG_Function)0x0) {
    lVar6 = 0;
    do {
      iVar3 = (*g_rng_function)((uint8_t *)random,num_words * 8);
      if (iVar3 == 0) {
        return 0;
      }
      random[(long)num_words + -1] =
           random[(long)num_words + -1] & 0xffffffffffffffffU >> (-(char)bVar2 & 0x3fU);
      if ('\0' < num_words) {
        uVar5 = 0;
        uVar4 = 0;
        do {
          uVar4 = uVar4 | random[uVar5];
          uVar5 = uVar5 + 1;
        } while ((byte)num_words != uVar5);
        if ((uVar4 != 0) && (cVar1 = uECC_vli_cmp(top,random,num_words), cVar1 == '\x01')) {
          return 1;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x40);
  }
  return 0;
}

Assistant:

uECC_VLI_API int uECC_generate_random_int(uECC_word_t *random,
                                          const uECC_word_t *top,
                                          wordcount_t num_words) {
    uECC_word_t mask = (uECC_word_t)-1;
    uECC_word_t tries;
    bitcount_t num_bits = uECC_vli_numBits(top, num_words);

    if (!g_rng_function) {
        return 0;
    }

    for (tries = 0; tries < uECC_RNG_MAX_TRIES; ++tries) {
        if (!g_rng_function((uint8_t *)random, num_words * uECC_WORD_SIZE)) {
            return 0;
	    }
        random[num_words - 1] &= mask >> ((bitcount_t)(num_words * uECC_WORD_SIZE * 8 - num_bits));
        if (!uECC_vli_isZero(random, num_words) &&
		        uECC_vli_cmp(top, random, num_words) == 1) {
            return 1;
        }
    }
    return 0;
}